

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O0

void __thiscall Assimp::XGLImporter::ReadFaceVertex(XGLImporter *this,TempMesh *t,TempFace *out)

{
  bool bVar1;
  char *closetag;
  reference ppVar2;
  reference ppVar3;
  aiVector3D aVar4;
  allocator local_199;
  string local_198;
  aiVector2D local_178;
  undefined8 local_170;
  float local_168;
  undefined8 local_15c;
  float local_154;
  undefined8 local_150;
  float local_148;
  undefined8 local_140;
  float local_138;
  allocator local_131;
  string local_130;
  _Self local_110;
  _Self local_108;
  const_iterator it_2;
  uint id_2;
  _Self local_d8;
  _Self local_d0;
  const_iterator it_1;
  uint id_1;
  _Self local_a0;
  _Self local_98;
  const_iterator it;
  undefined1 local_88 [4];
  uint id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  string *s;
  byte local_49;
  undefined1 local_48 [7];
  bool havep;
  undefined1 *local_28;
  string *end;
  TempFace *out_local;
  TempMesh *t_local;
  XGLImporter *this_local;
  
  end = (string *)out;
  out_local = (TempFace *)t;
  t_local = (TempMesh *)this;
  GetElementName_abi_cxx11_((string *)local_48,this);
  local_28 = local_48;
  local_49 = 0;
  while( true ) {
    closetag = (char *)std::__cxx11::string::c_str();
    bVar1 = ReadElementUpToClosing(this,closetag);
    if (!bVar1) break;
    GetElementName_abi_cxx11_((string *)local_88,this);
    local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88;
    bVar1 = std::operator==(local_68,"pref");
    if (bVar1) {
      it._M_node._4_4_ = ReadIndexFromText(this);
      local_98._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_aiVector3t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiVector3t<float>_>_>_>
           ::find((map<unsigned_int,_aiVector3t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiVector3t<float>_>_>_>
                   *)out_local,(key_type *)((long)&it._M_node + 4));
      local_a0._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_aiVector3t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiVector3t<float>_>_>_>
           ::end((map<unsigned_int,_aiVector3t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiVector3t<float>_>_>_>
                  *)out_local);
      bVar1 = std::operator==(&local_98,&local_a0);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&id_1,"point index out of range",(allocator *)((long)&it_1._M_node + 7)
                  );
        LogFunctions<Assimp::XGLImporter>::ThrowException((string *)&id_1);
        std::__cxx11::string::~string((string *)&id_1);
        std::allocator<char>::~allocator((allocator<char> *)((long)&it_1._M_node + 7));
      }
      ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_aiVector3t<float>_>_>::
               operator*(&local_98);
      *(undefined8 *)end = *(undefined8 *)&ppVar2->second;
      *(float *)&end->_M_string_length = (ppVar2->second).z;
      local_49 = 1;
    }
    else {
      bVar1 = std::operator==(local_68,"nref");
      if (bVar1) {
        it_1._M_node._0_4_ = ReadIndexFromText(this);
        local_d0._M_node =
             (_Base_ptr)
             std::
             map<unsigned_int,_aiVector3t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiVector3t<float>_>_>_>
             ::find((map<unsigned_int,_aiVector3t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiVector3t<float>_>_>_>
                     *)&out_local[1].normal,(key_type *)&it_1);
        local_d8._M_node =
             (_Base_ptr)
             std::
             map<unsigned_int,_aiVector3t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiVector3t<float>_>_>_>
             ::end((map<unsigned_int,_aiVector3t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiVector3t<float>_>_>_>
                    *)&out_local[1].normal);
        bVar1 = std::operator==(&local_d0,&local_d8);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&id_2,"normal index out of range",
                     (allocator *)((long)&it_2._M_node + 7));
          LogFunctions<Assimp::XGLImporter>::ThrowException((string *)&id_2);
          std::__cxx11::string::~string((string *)&id_2);
          std::allocator<char>::~allocator((allocator<char> *)((long)&it_2._M_node + 7));
        }
        ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_aiVector3t<float>_>_>::
                 operator*(&local_d0);
        *(undefined8 *)((long)&end->_M_string_length + 4) = *(undefined8 *)&ppVar2->second;
        *(float *)((long)&end->field_2 + 4) = (ppVar2->second).z;
        end[1].field_0x1 = 1;
      }
      else {
        bVar1 = std::operator==(local_68,"tcref");
        if (bVar1) {
          it_2._M_node._0_4_ = ReadIndexFromText(this);
          local_108._M_node =
               (_Base_ptr)
               std::
               map<unsigned_int,_aiVector2t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiVector2t<float>_>_>_>
               ::find((map<unsigned_int,_aiVector2t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiVector2t<float>_>_>_>
                       *)&out_local[2].uv,(key_type *)&it_2);
          local_110._M_node =
               (_Base_ptr)
               std::
               map<unsigned_int,_aiVector2t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiVector2t<float>_>_>_>
               ::end((map<unsigned_int,_aiVector2t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiVector2t<float>_>_>_>
                      *)&out_local[2].uv);
          bVar1 = std::operator==(&local_108,&local_110);
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_130,"uv index out of range",&local_131);
            LogFunctions<Assimp::XGLImporter>::ThrowException(&local_130);
            std::__cxx11::string::~string((string *)&local_130);
            std::allocator<char>::~allocator((allocator<char> *)&local_131);
          }
          ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_aiVector2t<float>_>_>
                   ::operator*(&local_108);
          *(aiVector2t<float> *)((long)&end->field_2 + 8) = ppVar3->second;
          end[1]._M_dataplus = (_Alloc_hider)0x1;
        }
        else {
          bVar1 = std::operator==(local_68,"p");
          if (bVar1) {
            aVar4 = ReadVec3(this);
            local_148 = aVar4.z;
            local_150 = aVar4._0_8_;
            *(undefined8 *)end = local_150;
            *(float *)&end->_M_string_length = local_148;
            local_140 = local_150;
            local_138 = local_148;
          }
          else {
            bVar1 = std::operator==(local_68,"n");
            if (bVar1) {
              aVar4 = ReadVec3(this);
              local_168 = aVar4.z;
              local_170 = aVar4._0_8_;
              *(undefined8 *)((long)&end->_M_string_length + 4) = local_170;
              *(float *)((long)&end->field_2 + 4) = local_168;
              local_15c = local_170;
              local_154 = local_168;
            }
            else {
              bVar1 = std::operator==(local_68,"tc");
              if (bVar1) {
                local_178 = ReadVec2(this);
                *(aiVector2D *)((long)&end->field_2 + 8) = local_178;
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_88);
  }
  if ((local_49 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_198,"missing <pref> in <fvN> element",&local_199);
    LogFunctions<Assimp::XGLImporter>::ThrowException(&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void XGLImporter::ReadFaceVertex(const TempMesh& t, TempFace& out)
{
    const std::string& end = GetElementName();

    bool havep = false;
    while (ReadElementUpToClosing(end.c_str()))  {
        const std::string& s = GetElementName();
        if (s == "pref") {
            const unsigned int id = ReadIndexFromText();
            std::map<unsigned int, aiVector3D>::const_iterator it = t.points.find(id);
            if (it == t.points.end()) {
                ThrowException("point index out of range");
            }

            out.pos = (*it).second;
            havep = true;
        }
        else if (s == "nref") {
            const unsigned int id = ReadIndexFromText();
            std::map<unsigned int, aiVector3D>::const_iterator it = t.normals.find(id);
            if (it == t.normals.end()) {
                ThrowException("normal index out of range");
            }

            out.normal = (*it).second;
            out.has_normal = true;
        }
        else if (s == "tcref") {
            const unsigned int id = ReadIndexFromText();
            std::map<unsigned int, aiVector2D>::const_iterator it = t.uvs.find(id);
            if (it == t.uvs.end()) {
                ThrowException("uv index out of range");
            }

            out.uv = (*it).second;
            out.has_uv = true;
        }
        else if (s == "p") {
            out.pos = ReadVec3();
        }
        else if (s == "n") {
            out.normal = ReadVec3();
        }
        else if (s == "tc") {
            out.uv = ReadVec2();
        }
    }

    if (!havep) {
        ThrowException("missing <pref> in <fvN> element");
    }
}